

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

void __thiscall Process::Process(Process *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->mReadyReadStdOut).id = 0;
  *(undefined1 (*) [16])&(this->mReadyReadStdOut).mutex.super___mutex_base._M_mutex =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->mReadyReadStdOut).mutex.super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  (this->mReadyReadStdOut).mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  p_Var1 = &(this->mReadyReadStdOut).connections._M_t._M_impl.super__Rb_tree_header;
  (this->mReadyReadStdOut).connections._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->mReadyReadStdOut).connections._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->mReadyReadStdOut).connections._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mReadyReadStdOut).connections._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mReadyReadStdOut).connections._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mReadyReadStdErr).id = 0;
  *(undefined1 (*) [16])&(this->mReadyReadStdErr).mutex.super___mutex_base._M_mutex =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->mReadyReadStdErr).mutex.super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  (this->mReadyReadStdErr).mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  p_Var1 = &(this->mReadyReadStdErr).connections._M_t._M_impl.super__Rb_tree_header;
  (this->mReadyReadStdErr).connections._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->mReadyReadStdErr).connections._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->mReadyReadStdErr).connections._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mReadyReadStdErr).connections._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mReadyReadStdErr).connections._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mFinished).id = 0;
  *(undefined1 (*) [16])((long)&(this->mFinished).mutex.super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->mFinished).mutex.super___mutex_base._M_mutex = (undefined1  [16])0x0
  ;
  (this->mFinished).mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  p_Var1 = &(this->mFinished).connections._M_t._M_impl.super__Rb_tree_header;
  (this->mFinished).connections._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mFinished).connections._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->mFinished).connections._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mFinished).connections._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mFinished).connections._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mMode = Sync;
  std::_Deque_base<String,_std::allocator<String>_>::_Deque_base
            (&(this->mStdInBuffer).super__Deque_base<String,_std::allocator<String>_>);
  (this->mStdOutBuffer).mString._M_dataplus._M_p = (pointer)&(this->mStdOutBuffer).mString.field_2;
  (this->mStdOutBuffer).mString._M_string_length = 0;
  (this->mStdOutBuffer).mString.field_2._M_local_buf[0] = '\0';
  (this->mStdErrBuffer).mString._M_dataplus._M_p = (pointer)&(this->mStdErrBuffer).mString.field_2;
  (this->mStdErrBuffer).mString._M_string_length = 0;
  (this->mStdErrBuffer).mString.field_2._M_local_buf[0] = '\0';
  (this->mMutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined1 (*) [16])&(this->mMutex).super___mutex_base._M_mutex = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->mMutex).super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  this->mReturn = -2;
  (this->mCwd).super_String.mString._M_dataplus._M_p =
       (pointer)&(this->mCwd).super_String.mString.field_2;
  (this->mCwd).super_String.mString._M_string_length = 0;
  (this->mCwd).super_String.mString.field_2._M_local_buf[0] = '\0';
  (this->mChRoot).super_String.mString._M_dataplus._M_p =
       (pointer)&(this->mChRoot).super_String.mString.field_2;
  (this->mChRoot).super_String.mString._M_string_length = 0;
  (this->mChRoot).super_String.mString.field_2._M_local_buf[0] = '\0';
  (this->mErrorString).mString._M_dataplus._M_p = (pointer)&(this->mErrorString).mString.field_2;
  (this->mErrorString).mString._M_string_length = 0;
  (this->mErrorString).mString.field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&this->mStdOutIndex + 1) = 0;
  this->mStdInIndex = 0;
  this->mStdOutIndex = 0;
  this->mPid = -1;
  std::call_once<void(&)()>(&sProcessHandler,ProcessThread::installProcessHandler);
  this->mStdErr[0] = -1;
  this->mStdErr[1] = -1;
  this->mSync[0] = -1;
  this->mSync[1] = -1;
  this->mStdIn[0] = -1;
  this->mStdIn[1] = -1;
  this->mStdOut[0] = -1;
  this->mStdOut[1] = -1;
  return;
}

Assistant:

Process::Process()
    : mMode(Sync), mReturn(ReturnUnset),
      mStdInIndex(0), mStdOutIndex(0), mStdErrIndex(0),
      mWantStdInClosed(false), mPid(-1)
{
    std::call_once(sProcessHandler, ProcessThread::installProcessHandler);

    mStdIn[0] = mStdIn[1] = -1;
    mStdOut[0] = mStdOut[1] = -1;
    mStdErr[0] = mStdErr[1] = -1;
    mSync[0] = mSync[1] = -1;
}